

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_c3bcac::HandleJSONCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *arguments,cmExecutionStatus *status)

{
  optional<(anonymous_namespace)::Args> errorPath_00;
  optional<(anonymous_namespace)::Args> errorPath_01;
  optional<(anonymous_namespace)::Args> errorPath_02;
  optional<(anonymous_namespace)::Args> errorPath_03;
  optional<(anonymous_namespace)::Args> errorPath_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var1;
  bool bVar2;
  ArrayIndex AVar3;
  uint max;
  ValueType VVar4;
  reference this;
  string *psVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  string *key;
  Value *pVVar8;
  json_error *pjVar9;
  Value *extraout_RDX;
  Value *extraout_RDX_00;
  Value *extraout_RDX_01;
  Value *extraout_RDX_02;
  Value *extraout_RDX_03;
  Value *extraout_RDX_04;
  Value *extraout_RDX_05;
  string_view sVar10;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  const_iterator cVar12;
  ValueConstIterator VVar13;
  Args path;
  Args path_00;
  Args path_01;
  Args path_02;
  Args path_03;
  Args path_04;
  bool local_c49;
  bool local_bca;
  string errorPath;
  json_error *e;
  Value json2;
  string *jsonstr2;
  string local_a38;
  string_view local_a18;
  undefined1 local_a02;
  _Storage<(anonymous_namespace)::Args,_true> local_a00;
  undefined8 local_9f0;
  string_view local_9e8;
  string_view local_9d8;
  string local_9c8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_998;
  Args local_990;
  optional<(anonymous_namespace)::Args> local_980;
  ArrayIndex local_964;
  undefined1 local_960 [4];
  int index_2;
  Value newValue;
  Value *value_5;
  string *toAdd;
  string *newValueStr;
  string local_890;
  string_view local_870;
  undefined1 local_859;
  _Storage<(anonymous_namespace)::Args,_true> local_858;
  undefined8 local_848;
  string_view local_840;
  string_view local_830;
  string local_820;
  undefined1 local_800 [8];
  Value removed_1;
  Value removed;
  Args local_798;
  optional<(anonymous_namespace)::Args> local_788;
  ArrayIndex local_76c;
  Value *pVStack_768;
  int index_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_760;
  Value *local_750;
  Value *value_4;
  char *pcStack_740;
  Value *local_738;
  char *pcStack_730;
  string *local_728;
  string *toRemove;
  char *local_718;
  string *local_710;
  char *local_708;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_700;
  string_view local_6f0;
  undefined1 local_6e0 [8];
  cmAlphaNum sizeStr;
  _Storage<(anonymous_namespace)::Args,_true> local_6a0;
  undefined8 local_690;
  string_view local_688;
  string_view local_678;
  string local_668;
  Value *local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_640;
  Value *local_630;
  Value *value_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_620;
  Value *local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_610;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_608;
  String local_5f8;
  string_view local_5d8;
  _Base_ptr local_5c8;
  undefined1 local_5c0;
  _Base_ptr local_5b8;
  undefined1 local_5b0;
  _Base_ptr local_5a8;
  undefined4 local_5a0;
  undefined1 local_598 [8];
  ValueConstIterator memIt;
  Args local_570;
  optional<(anonymous_namespace)::Args> local_560;
  difference_type local_548;
  undefined1 local_541;
  int index;
  undefined8 uStack_538;
  bool local_530;
  undefined7 uStack_52f;
  string_view local_528;
  string_view local_518;
  string local_508;
  Value *local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_4e0;
  Value *local_4d0;
  Value *value_2;
  char *pcStack_4c0;
  Value *local_4b8;
  char *pcStack_4b0;
  string *local_4a0;
  string *indexStr;
  char *local_490;
  string *local_488;
  char *local_480;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_478;
  string_view local_468;
  Value *local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_450;
  Value *local_440;
  Value *value_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_430;
  Value *local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_420;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_418;
  String local_408;
  string_view local_3e8;
  string local_3d8;
  string_view local_3b8;
  Value *local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_3a0;
  Value *local_398;
  Value *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_388;
  Value *local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_378;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_370;
  undefined1 local_360 [8];
  Value json;
  string *jsonstr;
  _Storage<(anonymous_namespace)::Args,_true> local_300;
  undefined8 local_2f0;
  string_view local_2e8;
  string_view local_2d8;
  string local_2c8;
  basic_string_view<char,_std::char_traits<char>_> local_2a8;
  basic_string_view<char,_std::char_traits<char>_> local_298;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_288;
  basic_string_view<char,_std::char_traits<char>_> local_278;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_258;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_228;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  basic_string_view<char,_std::char_traits<char>_> local_208;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1f8;
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1c8;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_198;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_168;
  string_view local_158;
  string_view local_148;
  string *local_130;
  string *mode;
  char *pcStack_120;
  string *local_118;
  char *pcStack_110;
  string_view local_108;
  string_view local_f8;
  string_view local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_a8;
  string_view local_88;
  string_view local_78;
  byte local_59;
  string *psStack_58;
  bool success;
  string *outputVariable;
  string *errorVariable;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  undefined1 auStack_30 [8];
  Args args;
  cmMakefile *makefile;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  args.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .End._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       cmExecutionStatus::GetMakefile(status);
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(arguments);
  local_38 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator+(&local_40,1);
  errorVariable =
       (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(arguments);
  Args::cmRange((Args *)auStack_30,local_38,
                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )errorVariable);
  outputVariable = (string *)0x0;
  psStack_58 = (string *)0x0;
  local_59 = 1;
  local_88 = (string_view)::cm::operator____s("missing out-var argument",0x18);
  local_78 = local_88;
  psStack_58 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)auStack_30,local_88);
  bVar2 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::empty((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)auStack_30);
  local_bca = false;
  if (!bVar2) {
    local_b0 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)auStack_30);
    this = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_b0);
    local_a8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
    local_d0 = (basic_string_view<char,_std::char_traits<char>_>)
               ::cm::operator____s("ERROR_VARIABLE",0xe);
    local_c0 = local_d0;
    local_bca = std::operator==(local_a8,local_d0);
  }
  if (local_bca != false) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e0,"");
    (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)auStack_30,local_e0);
    local_108 = (string_view)::cm::operator____s("missing error-var argument",0x1a);
    local_f8 = local_108;
    psVar5 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)auStack_30,local_108);
    _Var6 = args.
            super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .End;
    outputVariable = psVar5;
    sVar10 = (string_view)::cm::operator____s("NOTFOUND",8);
    pcStack_120 = sVar10._M_str;
    mode = (string *)sVar10._M_len;
    local_118 = mode;
    pcStack_110 = pcStack_120;
    cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,sVar10);
  }
  local_158 = (string_view)::cm::operator____s("missing mode argument",0x15);
  local_148 = local_158;
  local_130 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)auStack_30,local_158);
  local_168 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
  local_188 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("GET",3);
  local_178 = local_188;
  bVar2 = std::operator!=(local_168,local_188);
  local_c49 = false;
  if (bVar2) {
    local_198 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
    local_1b8 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("TYPE",4);
    local_1a8 = local_1b8;
    bVar2 = std::operator!=(local_198,local_1b8);
    local_c49 = false;
    if (bVar2) {
      local_1c8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
      local_1e8 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("MEMBER",6);
      local_1d8 = local_1e8;
      bVar2 = std::operator!=(local_1c8,local_1e8);
      local_c49 = false;
      if (bVar2) {
        local_1f8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
        local_218 = (basic_string_view<char,_std::char_traits<char>_>)
                    ::cm::operator____s("LENGTH",6);
        local_208 = local_218;
        bVar2 = std::operator!=(local_1f8,local_218);
        local_c49 = false;
        if (bVar2) {
          local_228 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
          local_248 = (basic_string_view<char,_std::char_traits<char>_>)
                      ::cm::operator____s("REMOVE",6);
          local_238 = local_248;
          bVar2 = std::operator!=(local_228,local_248);
          local_c49 = false;
          if (bVar2) {
            local_258 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)local_130);
            local_278 = (basic_string_view<char,_std::char_traits<char>_>)
                        ::cm::operator____s("SET",3);
            local_268 = local_278;
            bVar2 = std::operator!=(local_258,local_278);
            local_c49 = false;
            if (bVar2) {
              local_288 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)local_130);
              local_2a8 = (basic_string_view<char,_std::char_traits<char>_>)
                          ::cm::operator____s("EQUAL",5);
              local_298 = local_2a8;
              local_c49 = std::operator!=(local_288,local_2a8);
            }
          }
        }
      }
    }
  }
  if (local_c49 != false) {
    pjVar9 = (json_error *)__cxa_allocate_exception(0x28);
    local_2d8 = (string_view)::cm::operator____s("got an invalid mode \'",0x15);
    psVar5 = local_130;
    local_2e8 = (string_view)
                ::cm::operator____s("\', expected one of GET, TYPE, MEMBER, LENGTH, REMOVE, SET,  EQUAL"
                                    ,0x41);
    cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
              (&local_2c8,(static_string_view *)&local_2d8,psVar5,(static_string_view *)&local_2e8);
    std::optional<(anonymous_namespace)::Args>::optional
              ((optional<(anonymous_namespace)::Args> *)&local_300);
    errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current =
         local_300._M_value.
         super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         .End._M_current;
    errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .Begin._M_current =
         local_300._M_value.
         super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         .Begin._M_current;
    errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = local_2f0;
    json_error::json_error(pjVar9,&local_2c8,errorPath_00);
    __cxa_throw(pjVar9,&(anonymous_namespace)::json_error::typeinfo,json_error::~json_error);
  }
  sVar10 = (string_view)::cm::operator____s("missing json string argument",0x1c);
  json.limit_ = sVar10._M_len;
  psVar5 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)auStack_30,sVar10);
  ReadJson((Value *)local_360,psVar5);
  local_370 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
  bVar11 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("GET",3);
  _Var6._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar11._M_str;
  value = (Value *)bVar11._M_len;
  local_388 = _Var6._M_current;
  local_380 = value;
  local_378 = _Var6._M_current;
  bVar2 = std::operator==(local_370,bVar11);
  if (!bVar2) {
    local_418 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
    bVar11 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("TYPE",4);
    _Var6._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar11._M_str;
    value_1 = (Value *)bVar11._M_len;
    local_430 = _Var6._M_current;
    local_428 = value_1;
    local_420 = _Var6._M_current;
    bVar2 = std::operator==(local_418,bVar11);
    if (bVar2) {
      local_458 = (Value *)auStack_30;
      pbStack_450 = args.
                    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .Begin._M_current;
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var6._M_current;
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current =
           args.
           super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .Begin._M_current;
      local_440 = ResolvePath((anon_unknown_dwarf_c3bcac *)local_360,(Value *)auStack_30,path_00);
      _Var6 = args.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .End;
      psVar5 = psStack_58;
      VVar4 = Json::Value::type(local_440);
      local_468 = JsonTypeToString(VVar4);
      cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,local_468);
    }
    else {
      local_478 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
      bVar11 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("MEMBER",6);
      local_490 = bVar11._M_str;
      indexStr = (string *)bVar11._M_len;
      local_488 = indexStr;
      local_480 = local_490;
      bVar2 = std::operator==(local_478,bVar11);
      if (bVar2) {
        sVar10 = (string_view)::cm::operator____s("missing member index",0x14);
        pcStack_4c0 = sVar10._M_str;
        _Var6._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar10._M_len;
        value_2 = (Value *)_Var6._M_current;
        local_4b8 = (Value *)_Var6._M_current;
        pcStack_4b0 = pcStack_4c0;
        local_4a0 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)auStack_30,sVar10);
        local_4e8 = (Value *)auStack_30;
        pbStack_4e0 = args.
                      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .Begin._M_current;
        path_01.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current = _Var6._M_current;
        path_01.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current =
             args.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .Begin._M_current;
        local_4d0 = ResolvePath((anon_unknown_dwarf_c3bcac *)local_360,(Value *)auStack_30,path_01);
        bVar2 = Json::Value::isObject(local_4d0);
        psVar5 = local_4a0;
        if (!bVar2) {
          local_541 = 1;
          pjVar9 = (json_error *)__cxa_allocate_exception(0x28);
          local_518 = (string_view)
                      ::cm::operator____s("MEMBER needs to be called with an element of type OBJECT, got "
                                          ,0x3e);
          VVar4 = Json::Value::type(local_4d0);
          local_528 = JsonTypeToString(VVar4);
          cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>
                    (&local_508,(static_string_view *)&local_518,&local_528);
          std::optional<(anonymous_namespace)::Args>::optional<(anonymous_namespace)::Args_&,_true>
                    ((optional<(anonymous_namespace)::Args> *)&index,(Args *)auStack_30);
          errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .End._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )uStack_538;
          errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .Begin._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )_index;
          errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged = local_530;
          errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._17_7_ = uStack_52f;
          json_error::json_error(pjVar9,&local_508,errorPath_01);
          local_541 = 0;
          __cxa_throw(pjVar9,&(anonymous_namespace)::json_error::typeinfo,json_error::~json_error);
        }
        _Var6 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)auStack_30);
        memIt.super_ValueIteratorBase._8_8_ =
             cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)auStack_30);
        _Var7 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator+((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&memIt.super_ValueIteratorBase.isNull_,1);
        Args::cmRange(&local_570,_Var6,_Var7);
        std::optional<(anonymous_namespace)::Args>::optional<(anonymous_namespace)::Args,_true>
                  (&local_560,&local_570);
        AVar3 = Json::Value::size(local_4d0);
        local_548 = ParseIndex(psVar5,&local_560,AVar3);
        cVar12 = Json::Value::begin(local_4d0);
        local_5b8 = (_Base_ptr)cVar12.super_ValueIteratorBase.current_._M_node;
        local_5b0 = cVar12.super_ValueIteratorBase.isNull_;
        local_5a0 = CONCAT31(local_5a0._1_3_,local_5b0);
        VVar13.super_ValueIteratorBase._8_4_ = local_5a0;
        VVar13.super_ValueIteratorBase.current_._M_node = local_5b8;
        VVar13.super_ValueIteratorBase._12_4_ = 0;
        local_5a8 = local_5b8;
        VVar13 = std::next<Json::ValueConstIterator>(VVar13,local_548);
        _Var6 = args.
                super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .End;
        psVar5 = psStack_58;
        local_5c8 = (_Base_ptr)VVar13.super_ValueIteratorBase.current_._M_node;
        local_5c0 = VVar13.super_ValueIteratorBase.isNull_;
        local_598 = (undefined1  [8])local_5c8;
        memIt.super_ValueIteratorBase.current_._M_node._0_1_ = local_5c0;
        Json::ValueIteratorBase::name_abi_cxx11_(&local_5f8,(ValueIteratorBase *)local_598);
        local_5d8 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_5f8);
        cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,local_5d8);
        std::__cxx11::string::~string((string *)&local_5f8);
      }
      else {
        local_608 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
        bVar11 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("LENGTH",6);
        _Var6._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar11._M_str;
        value_3 = (Value *)bVar11._M_len;
        local_620 = _Var6._M_current;
        local_618 = value_3;
        local_610 = _Var6._M_current;
        bVar2 = std::operator==(local_608,bVar11);
        if (bVar2) {
          local_648 = (Value *)auStack_30;
          pbStack_640 = args.
                        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .Begin._M_current;
          path_02.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .End._M_current = _Var6._M_current;
          path_02.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .Begin._M_current =
               args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .Begin._M_current;
          local_630 = ResolvePath((anon_unknown_dwarf_c3bcac *)local_360,(Value *)auStack_30,path_02
                                 );
          bVar2 = Json::Value::isArray(local_630);
          if (!bVar2) {
            bVar2 = Json::Value::isObject(local_630);
            if (!bVar2) {
              sizeStr.Digits_[0x1f] = '\x01';
              pjVar9 = (json_error *)__cxa_allocate_exception(0x28);
              local_678 = (string_view)
                          ::cm::operator____s("LENGTH needs to be called with an element of type ARRAY or OBJECT, got "
                                              ,0x47);
              VVar4 = Json::Value::type(local_630);
              local_688 = JsonTypeToString(VVar4);
              cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>
                        (&local_668,(static_string_view *)&local_678,&local_688);
              std::optional<(anonymous_namespace)::Args>::
              optional<(anonymous_namespace)::Args_&,_true>
                        ((optional<(anonymous_namespace)::Args> *)&local_6a0._M_value,
                         (Args *)auStack_30);
              errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
              super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .End._M_current =
                   local_6a0._M_value.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .End._M_current;
              errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
              super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .Begin._M_current =
                   local_6a0._M_value.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .Begin._M_current;
              errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
              super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = local_690;
              json_error::json_error(pjVar9,&local_668,errorPath_02);
              sizeStr.Digits_[0x1f] = '\0';
              __cxa_throw(pjVar9,&(anonymous_namespace)::json_error::typeinfo,
                          json_error::~json_error);
            }
          }
          AVar3 = Json::Value::size(local_630);
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_6e0,AVar3);
          _Var6 = args.
                  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .End;
          psVar5 = psStack_58;
          local_6f0 = cmAlphaNum::View((cmAlphaNum *)local_6e0);
          cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,local_6f0);
        }
        else {
          local_700 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
          bVar11 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("REMOVE",6)
          ;
          local_718 = bVar11._M_str;
          toRemove = (string *)bVar11._M_len;
          local_710 = toRemove;
          local_708 = local_718;
          bVar2 = std::operator==(local_700,bVar11);
          if (bVar2) {
            sVar10 = (string_view)::cm::operator____s("missing member or index to remove",0x21);
            pcStack_740 = sVar10._M_str;
            _Var6._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar10._M_len;
            value_4 = (Value *)_Var6._M_current;
            local_738 = (Value *)_Var6._M_current;
            pcStack_730 = pcStack_740;
            local_728 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)auStack_30,sVar10);
            pVStack_768 = (Value *)auStack_30;
            pbStack_760 = args.
                          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .Begin._M_current;
            path_03.
            super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .End._M_current = _Var6._M_current;
            path_03.
            super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .Begin._M_current =
                 args.
                 super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .Begin._M_current;
            local_750 = ResolvePath((anon_unknown_dwarf_c3bcac *)local_360,(Value *)auStack_30,
                                    path_03);
            bVar2 = Json::Value::isArray(local_750);
            psVar5 = local_728;
            if (bVar2) {
              _Var6 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)auStack_30);
              removed.limit_ =
                   (ptrdiff_t)
                   cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)auStack_30);
              _Var7 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator+((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&removed.limit_,1);
              Args::cmRange(&local_798,_Var6,_Var7);
              std::optional<(anonymous_namespace)::Args>::
              optional<(anonymous_namespace)::Args,_true>(&local_788,&local_798);
              AVar3 = Json::Value::size(local_750);
              local_76c = ParseIndex(psVar5,&local_788,AVar3);
              Json::Value::Value((Value *)&removed_1.limit_,nullValue);
              Json::Value::removeIndex(local_750,local_76c,(Value *)&removed_1.limit_);
              Json::Value::~Value((Value *)&removed_1.limit_);
              pVVar8 = extraout_RDX_01;
            }
            else {
              bVar2 = Json::Value::isObject(local_750);
              if (!bVar2) {
                local_859 = 1;
                pjVar9 = (json_error *)__cxa_allocate_exception(0x28);
                local_830 = (string_view)
                            ::cm::operator____s("REMOVE needs to be called with an element of type ARRAY or OBJECT, got "
                                                ,0x47);
                VVar4 = Json::Value::type(local_750);
                local_840 = JsonTypeToString(VVar4);
                cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>
                          (&local_820,(static_string_view *)&local_830,&local_840);
                std::optional<(anonymous_namespace)::Args>::
                optional<(anonymous_namespace)::Args_&,_true>
                          ((optional<(anonymous_namespace)::Args> *)&local_858._M_value,
                           (Args *)auStack_30);
                errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>.
                _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload.
                _M_value.
                super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .End._M_current =
                     local_858._M_value.
                     super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .End._M_current;
                errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>.
                _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload.
                _M_value.
                super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .Begin._M_current =
                     local_858._M_value.
                     super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .Begin._M_current;
                errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>.
                _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ =
                     local_848;
                json_error::json_error(pjVar9,&local_820,errorPath_03);
                local_859 = 0;
                __cxa_throw(pjVar9,&(anonymous_namespace)::json_error::typeinfo,
                            json_error::~json_error);
              }
              Json::Value::Value((Value *)local_800,nullValue);
              Json::Value::removeMember(local_750,local_728,(Value *)local_800);
              Json::Value::~Value((Value *)local_800);
              pVVar8 = extraout_RDX_02;
            }
            _Var6._M_current =
                 args.
                 super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .End._M_current;
            psVar5 = psStack_58;
            (anonymous_namespace)::WriteJson_abi_cxx11_
                      (&local_890,(_anonymous_namespace_ *)local_360,pVVar8);
            local_870 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_890);
            cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,local_870);
            std::__cxx11::string::~string((string *)&local_890);
          }
          else {
            _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
            bVar11 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("SET",3);
            bVar2 = std::operator==(_Var1,bVar11);
            if (bVar2) {
              sVar10 = (string_view)::cm::operator____s("missing new value remove",0x18);
              psVar5 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)auStack_30,sVar10);
              sVar10 = (string_view)::cm::operator____s("missing member name to add",0x1a);
              _Var6._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   sVar10._M_len;
              key = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)auStack_30,sVar10);
              newValue.limit_ = (ptrdiff_t)auStack_30;
              path_04.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .End._M_current = _Var6._M_current;
              path_04.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .Begin._M_current =
                   args.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .Begin._M_current;
              pVVar8 = ResolvePath((anon_unknown_dwarf_c3bcac *)local_360,(Value *)auStack_30,
                                   path_04);
              ReadJson((Value *)local_960,psVar5);
              bVar2 = Json::Value::isObject(pVVar8);
              if (bVar2) {
                pVVar8 = Json::Value::operator[](pVVar8,key);
                Json::Value::operator=(pVVar8,(Value *)local_960);
                pVVar8 = extraout_RDX_03;
              }
              else {
                bVar2 = Json::Value::isArray(pVVar8);
                if (!bVar2) {
                  local_a02 = 1;
                  pjVar9 = (json_error *)__cxa_allocate_exception(0x28);
                  local_9d8 = (string_view)
                              ::cm::operator____s("SET needs to be called with an element of type OBJECT or ARRAY, got "
                                                  ,0x44);
                  VVar4 = Json::Value::type(pVVar8);
                  local_9e8 = JsonTypeToString(VVar4);
                  cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>
                            (&local_9c8,(static_string_view *)&local_9d8,&local_9e8);
                  std::optional<(anonymous_namespace)::Args>::optional
                            ((optional<(anonymous_namespace)::Args> *)&local_a00);
                  errorPath_04.super__Optional_base<(anonymous_namespace)::Args,_true,_true>.
                  _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload.
                  _M_value.
                  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .End._M_current =
                       local_a00._M_value.
                       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .End._M_current;
                  errorPath_04.super__Optional_base<(anonymous_namespace)::Args,_true,_true>.
                  _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload.
                  _M_value.
                  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .Begin._M_current =
                       local_a00._M_value.
                       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .Begin._M_current;
                  errorPath_04.super__Optional_base<(anonymous_namespace)::Args,_true,_true>.
                  _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ =
                       local_9f0;
                  json_error::json_error(pjVar9,&local_9c8,errorPath_04);
                  local_a02 = 0;
                  __cxa_throw(pjVar9,&(anonymous_namespace)::json_error::typeinfo,
                              json_error::~json_error);
                }
                local_998 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)auStack_30);
                local_9a8 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)auStack_30);
                local_9a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator+(&local_9a8,1);
                Args::cmRange(&local_990,local_998,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )local_9a0);
                std::optional<(anonymous_namespace)::Args>::
                optional<(anonymous_namespace)::Args,_true>(&local_980,&local_990);
                max = std::numeric_limits<unsigned_int>::max();
                local_964 = ParseIndex(key,&local_980,max);
                bVar2 = Json::Value::isValidIndex(pVVar8,local_964);
                if (bVar2) {
                  pVVar8 = Json::Value::operator[](pVVar8,local_964);
                  Json::Value::operator=(pVVar8,(Value *)local_960);
                  pVVar8 = extraout_RDX_04;
                }
                else {
                  Json::Value::append(pVVar8,(Value *)local_960);
                  pVVar8 = extraout_RDX_05;
                }
              }
              _Var6._M_current =
                   args.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .End._M_current;
              psVar5 = psStack_58;
              (anonymous_namespace)::WriteJson_abi_cxx11_
                        (&local_a38,(_anonymous_namespace_ *)local_360,pVVar8);
              local_a18 = (string_view)
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)&local_a38);
              cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,local_a18);
              std::__cxx11::string::~string((string *)&local_a38);
              Json::Value::~Value((Value *)local_960);
            }
            else {
              _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
              bVar11 = (basic_string_view<char,_std::char_traits<char>_>)
                       ::cm::operator____s("EQUAL",5);
              bVar2 = std::operator==(_Var1,bVar11);
              if (bVar2) {
                sVar10 = (string_view)
                         ::cm::operator____s("missing second json string argument",0x23);
                json2.limit_ = sVar10._M_len;
                psVar5 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)auStack_30,sVar10)
                ;
                ReadJson((Value *)&e,psVar5);
                _Var6 = args.
                        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .End;
                psVar5 = psStack_58;
                bVar2 = Json::Value::operator==((Value *)local_360,(Value *)&e);
                cmMakefile::AddDefinitionBool((cmMakefile *)_Var6._M_current,psVar5,bVar2);
                Json::Value::~Value((Value *)&e);
              }
            }
          }
        }
      }
    }
    goto LAB_00677c26;
  }
  local_3a8 = (Value *)auStack_30;
  pbStack_3a0 = args.
                super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .Begin._M_current;
  path.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .End._M_current = _Var6._M_current;
  path.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .Begin._M_current =
       args.
       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       .Begin._M_current;
  local_398 = ResolvePath((anon_unknown_dwarf_c3bcac *)local_360,(Value *)auStack_30,path);
  bVar2 = Json::Value::isObject(local_398);
  pVVar8 = extraout_RDX;
  if (bVar2) {
LAB_0067643b:
    _Var6._M_current =
         args.
         super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         .End._M_current;
    psVar5 = psStack_58;
    (anonymous_namespace)::WriteJson_abi_cxx11_
              (&local_3d8,(_anonymous_namespace_ *)local_398,pVVar8);
    local_3b8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3d8);
    cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,local_3b8);
    std::__cxx11::string::~string((string *)&local_3d8);
  }
  else {
    bVar2 = Json::Value::isArray(local_398);
    pVVar8 = extraout_RDX_00;
    if (bVar2) goto LAB_0067643b;
    bVar2 = Json::Value::isBool(local_398);
    _Var6 = args.
            super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .End;
    psVar5 = psStack_58;
    if (bVar2) {
      bVar2 = Json::Value::asBool(local_398);
      cmMakefile::AddDefinitionBool((cmMakefile *)_Var6._M_current,psVar5,bVar2);
    }
    else {
      Json::Value::asString_abi_cxx11_(&local_408,local_398);
      local_3e8 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_408);
      cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
    }
  }
LAB_00677c26:
  Json::Value::~Value((Value *)local_360);
  return (bool)(local_59 & 1);
}

Assistant:

bool HandleJSONCommand(std::vector<std::string> const& arguments,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)

  auto& makefile = status.GetMakefile();
  Args args{ arguments.begin() + 1, arguments.end() };

  const std::string* errorVariable = nullptr;
  const std::string* outputVariable = nullptr;
  bool success = true;

  try {
    outputVariable = &args.PopFront("missing out-var argument"_s);

    if (!args.empty() && *args.begin() == "ERROR_VARIABLE"_s) {
      args.PopFront("");
      errorVariable = &args.PopFront("missing error-var argument"_s);
      makefile.AddDefinition(*errorVariable, "NOTFOUND"_s);
    }

    const auto& mode = args.PopFront("missing mode argument"_s);
    if (mode != "GET"_s && mode != "TYPE"_s && mode != "MEMBER"_s &&
        mode != "LENGTH"_s && mode != "REMOVE"_s && mode != "SET"_s &&
        mode != "EQUAL"_s) {
      throw json_error(
        cmStrCat("got an invalid mode '"_s, mode,
                 "', expected one of GET, TYPE, MEMBER, LENGTH, REMOVE, SET, "
                 " EQUAL"_s));
    }

    const auto& jsonstr = args.PopFront("missing json string argument"_s);
    Json::Value json = ReadJson(jsonstr);

    if (mode == "GET"_s) {
      const auto& value = ResolvePath(json, args);
      if (value.isObject() || value.isArray()) {
        makefile.AddDefinition(*outputVariable, WriteJson(value));
      } else if (value.isBool()) {
        makefile.AddDefinitionBool(*outputVariable, value.asBool());
      } else {
        makefile.AddDefinition(*outputVariable, value.asString());
      }

    } else if (mode == "TYPE"_s) {
      const auto& value = ResolvePath(json, args);
      makefile.AddDefinition(*outputVariable, JsonTypeToString(value.type()));

    } else if (mode == "MEMBER"_s) {
      const auto& indexStr = args.PopBack("missing member index"_s);
      const auto& value = ResolvePath(json, args);
      if (!value.isObject()) {
        throw json_error(
          cmStrCat("MEMBER needs to be called with an element of "
                   "type OBJECT, got "_s,
                   JsonTypeToString(value.type())),
          args);
      }
      const auto index = ParseIndex(
        indexStr, Args{ args.begin(), args.end() + 1 }, value.size());
      const auto memIt = std::next(value.begin(), index);
      makefile.AddDefinition(*outputVariable, memIt.name());

    } else if (mode == "LENGTH"_s) {
      const auto& value = ResolvePath(json, args);
      if (!value.isArray() && !value.isObject()) {
        throw json_error(cmStrCat("LENGTH needs to be called with an "
                                  "element of type ARRAY or OBJECT, got "_s,
                                  JsonTypeToString(value.type())),
                         args);
      }

      cmAlphaNum sizeStr{ value.size() };
      makefile.AddDefinition(*outputVariable, sizeStr.View());

    } else if (mode == "REMOVE"_s) {
      const auto& toRemove =
        args.PopBack("missing member or index to remove"_s);
      auto& value = ResolvePath(json, args);

      if (value.isArray()) {
        const auto index = ParseIndex(
          toRemove, Args{ args.begin(), args.end() + 1 }, value.size());
        Json::Value removed;
        value.removeIndex(index, &removed);

      } else if (value.isObject()) {
        Json::Value removed;
        value.removeMember(toRemove, &removed);

      } else {
        throw json_error(cmStrCat("REMOVE needs to be called with an "
                                  "element of type ARRAY or OBJECT, got "_s,
                                  JsonTypeToString(value.type())),
                         args);
      }
      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "SET"_s) {
      const auto& newValueStr = args.PopBack("missing new value remove"_s);
      const auto& toAdd = args.PopBack("missing member name to add"_s);
      auto& value = ResolvePath(json, args);

      Json::Value newValue = ReadJson(newValueStr);
      if (value.isObject()) {
        value[toAdd] = newValue;
      } else if (value.isArray()) {
        const auto index =
          ParseIndex(toAdd, Args{ args.begin(), args.end() + 1 });
        if (value.isValidIndex(index)) {
          value[static_cast<int>(index)] = newValue;
        } else {
          value.append(newValue);
        }
      } else {
        throw json_error(cmStrCat("SET needs to be called with an "
                                  "element of type OBJECT or ARRAY, got "_s,
                                  JsonTypeToString(value.type())));
      }

      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "EQUAL"_s) {
      const auto& jsonstr2 =
        args.PopFront("missing second json string argument"_s);
      Json::Value json2 = ReadJson(jsonstr2);
      makefile.AddDefinitionBool(*outputVariable, json == json2);
    }

  } catch (const json_error& e) {
    if (outputVariable && e.ErrorPath) {
      const auto errorPath = cmJoin(*e.ErrorPath, "-");
      makefile.AddDefinition(*outputVariable,
                             cmStrCat(errorPath, "-NOTFOUND"_s));
    } else if (outputVariable) {
      makefile.AddDefinition(*outputVariable, "NOTFOUND"_s);
    }

    if (errorVariable) {
      makefile.AddDefinition(*errorVariable, e.what());
    } else {
      status.SetError(cmStrCat("sub-command JSON "_s, e.what(), "."_s));
      success = false;
    }
  }
  return success;
#else
  status.SetError(cmStrCat(arguments[0], " not available during bootstrap"_s));
  return false;
#endif
}